

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O1

int testNNCompilerValidation(void)

{
  pointer pcVar1;
  int iVar2;
  string *psVar3;
  ConvolutionLayerParams *pCVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  ModelDescription *pMVar8;
  Type *pTVar9;
  FeatureType *pFVar10;
  ArrayFeatureType *pAVar11;
  StringFeatureType *pSVar12;
  DictionaryFeatureType *pDVar13;
  TypeUnion TVar14;
  StringVector *this;
  Type *pTVar15;
  InnerProductLayerParams *pIVar16;
  WeightParams *pWVar17;
  ostream *poVar18;
  Result res;
  Model m1;
  string probsName;
  string featureName;
  undefined1 local_c0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  Model local_98;
  string local_68;
  string local_48;
  
  CoreML::Specification::Model::Model(&local_98);
  if (local_98.description_ == (ModelDescription *)0x0) {
    pMVar8 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar8);
    local_98.description_ = pMVar8;
  }
  pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_98.description_)->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pcVar1 = local_c0 + 0x10;
  local_c0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"input","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar9->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_c0);
  if ((pointer)local_c0._0_8_ != pcVar1) {
    operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
  }
  if (pTVar9->type_ == (FeatureType *)0x0) {
    pFVar10 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar10);
    pTVar9->type_ = pFVar10;
  }
  pFVar10 = pTVar9->type_;
  if (pFVar10->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar10);
    pFVar10->_oneof_case_[0] = 5;
    pAVar11 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar11);
    (pFVar10->Type_).multiarraytype_ = pAVar11;
  }
  pAVar11 = (pFVar10->Type_).multiarraytype_;
  iVar2 = (pAVar11->shape_).total_size_;
  if ((pAVar11->shape_).current_size_ == iVar2) {
    google::protobuf::RepeatedField<long>::Reserve(&pAVar11->shape_,iVar2 + 1);
  }
  iVar2 = (pAVar11->shape_).current_size_;
  (pAVar11->shape_).current_size_ = iVar2 + 1;
  ((pAVar11->shape_).rep_)->elements[iVar2] = 1;
  if (pTVar9->type_ == (FeatureType *)0x0) {
    pFVar10 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar10);
    pTVar9->type_ = pFVar10;
  }
  pFVar10 = pTVar9->type_;
  if (pFVar10->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar10);
    pFVar10->_oneof_case_[0] = 5;
    pAVar11 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar11);
    (pFVar10->Type_).multiarraytype_ = pAVar11;
  }
  ((pFVar10->Type_).multiarraytype_)->datatype_ = 0x10040;
  if (local_98.description_ == (ModelDescription *)0x0) {
    pMVar8 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar8);
    local_98.description_ = pMVar8;
  }
  pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_98.description_)->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_c0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"middle","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar9->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_c0);
  if ((pointer)local_c0._0_8_ != pcVar1) {
    operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
  }
  if (pTVar9->type_ == (FeatureType *)0x0) {
    pFVar10 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar10);
    pTVar9->type_ = pFVar10;
  }
  pFVar10 = pTVar9->type_;
  if (pFVar10->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar10);
    pFVar10->_oneof_case_[0] = 5;
    pAVar11 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar11);
    (pFVar10->Type_).multiarraytype_ = pAVar11;
  }
  pAVar11 = (pFVar10->Type_).multiarraytype_;
  iVar2 = (pAVar11->shape_).total_size_;
  if ((pAVar11->shape_).current_size_ == iVar2) {
    google::protobuf::RepeatedField<long>::Reserve(&pAVar11->shape_,iVar2 + 1);
  }
  iVar2 = (pAVar11->shape_).current_size_;
  (pAVar11->shape_).current_size_ = iVar2 + 1;
  ((pAVar11->shape_).rep_)->elements[iVar2] = 1;
  if (pTVar9->type_ == (FeatureType *)0x0) {
    pFVar10 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar10);
    pTVar9->type_ = pFVar10;
  }
  pFVar10 = pTVar9->type_;
  if (pFVar10->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar10);
    pFVar10->_oneof_case_[0] = 5;
    pAVar11 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar11);
    (pFVar10->Type_).multiarraytype_ = pAVar11;
  }
  ((pFVar10->Type_).multiarraytype_)->datatype_ = 0x10040;
  if (local_98.description_ == (ModelDescription *)0x0) {
    pMVar8 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar8);
    local_98.description_ = pMVar8;
  }
  pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_98.description_)->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_c0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"features","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar9->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_c0);
  if ((pointer)local_c0._0_8_ != pcVar1) {
    operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
  }
  if (pTVar9->type_ == (FeatureType *)0x0) {
    pFVar10 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar10);
    pTVar9->type_ = pFVar10;
  }
  pFVar10 = pTVar9->type_;
  if (pFVar10->_oneof_case_[0] != 3) {
    CoreML::Specification::FeatureType::clear_Type(pFVar10);
    pFVar10->_oneof_case_[0] = 3;
    pSVar12 = (StringFeatureType *)operator_new(0x18);
    CoreML::Specification::StringFeatureType::StringFeatureType(pSVar12);
    (pFVar10->Type_).stringtype_ = pSVar12;
  }
  if (local_98.description_ == (ModelDescription *)0x0) {
    pMVar8 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar8);
    local_98.description_ = pMVar8;
  }
  pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_98.description_)->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_c0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"probs","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar9->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_c0);
  if ((pointer)local_c0._0_8_ != pcVar1) {
    operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
  }
  if (pTVar9->type_ == (FeatureType *)0x0) {
    pFVar10 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar10);
    pTVar9->type_ = pFVar10;
  }
  pFVar10 = pTVar9->type_;
  if (pFVar10->_oneof_case_[0] != 6) {
    CoreML::Specification::FeatureType::clear_Type(pFVar10);
    pFVar10->_oneof_case_[0] = 6;
    pDVar13 = (DictionaryFeatureType *)operator_new(0x20);
    CoreML::Specification::DictionaryFeatureType::DictionaryFeatureType(pDVar13);
    (pFVar10->Type_).dictionarytype_ = pDVar13;
  }
  if (pTVar9->type_ == (FeatureType *)0x0) {
    pFVar10 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar10);
    pTVar9->type_ = pFVar10;
  }
  pFVar10 = pTVar9->type_;
  if (pFVar10->_oneof_case_[0] != 6) {
    CoreML::Specification::FeatureType::clear_Type(pFVar10);
    pFVar10->_oneof_case_[0] = 6;
    pDVar13 = (DictionaryFeatureType *)operator_new(0x20);
    CoreML::Specification::DictionaryFeatureType::DictionaryFeatureType(pDVar13);
    (pFVar10->Type_).dictionarytype_ = pDVar13;
  }
  pDVar13 = (pFVar10->Type_).dictionarytype_;
  if (pDVar13->_oneof_case_[0] != 2) {
    CoreML::Specification::DictionaryFeatureType::clear_KeyType(pDVar13);
    pDVar13->_oneof_case_[0] = 2;
    pSVar12 = (StringFeatureType *)operator_new(0x18);
    CoreML::Specification::StringFeatureType::StringFeatureType(pSVar12);
    (pDVar13->KeyType_).stringkeytype_ = pSVar12;
  }
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"features","");
  if (local_98.description_ == (ModelDescription *)0x0) {
    pMVar8 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar8);
    local_98.description_ = pMVar8;
  }
  psVar3 = ((local_98.description_)->predictedfeaturename_).ptr_;
  if (psVar3 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
              (&(local_98.description_)->predictedfeaturename_,&local_48);
  }
  else {
    std::__cxx11::string::_M_assign((string *)psVar3);
  }
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"probs","");
  if (local_98.description_ == (ModelDescription *)0x0) {
    pMVar8 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar8);
    local_98.description_ = pMVar8;
  }
  psVar3 = ((local_98.description_)->predictedprobabilitiesname_).ptr_;
  if (psVar3 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
              (&(local_98.description_)->predictedprobabilitiesname_,&local_68);
  }
  else {
    std::__cxx11::string::_M_assign((string *)psVar3);
  }
  if (local_98._oneof_case_[0] != 0x193) {
    CoreML::Specification::Model::clear_Type(&local_98);
    local_98._oneof_case_[0] = 0x193;
    TVar14.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x68);
    CoreML::Specification::NeuralNetworkClassifier::NeuralNetworkClassifier
              (TVar14.neuralnetworkclassifier_);
    local_98.Type_.pipelineclassifier_ = TVar14.pipelineclassifier_;
  }
  TVar14 = local_98.Type_;
  if (*(uint32 *)((long)&(local_98.Type_.supportvectorclassifier_)->proba_ + 0xc) != 100) {
    CoreML::Specification::NeuralNetworkClassifier::clear_ClassLabels
              (local_98.Type_.neuralnetworkclassifier_);
    *(uint32 *)((long)&(TVar14.supportvectorclassifier_)->proba_ + 0xc) = 100;
    this = (StringVector *)operator_new(0x30);
    CoreML::Specification::StringVector::StringVector(this);
    ((ClassLabelsUnion *)&(TVar14.itemsimilarityrecommender_)->itemstringids_)->stringclasslabels_ =
         this;
  }
  CoreML::Specification::StringVector::add_vector
            (((ClassLabelsUnion *)&(TVar14.itemsimilarityrecommender_)->itemstringids_)->
             stringclasslabels_,"label1");
  pTVar15 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      ((RepeatedPtrFieldBase *)&(TVar14.pipeline_)->models_,(Type *)0x0);
  CoreML::Specification::NeuralNetworkLayer::add_input(pTVar15,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(pTVar15,"middle");
  if (pTVar15->_oneof_case_[0] != 0x8c) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pTVar15);
    pTVar15->_oneof_case_[0] = 0x8c;
    pIVar16 = (InnerProductLayerParams *)operator_new(0x38);
    CoreML::Specification::InnerProductLayerParams::InnerProductLayerParams(pIVar16);
    (pTVar15->layer_).innerproduct_ = pIVar16;
  }
  pCVar4 = (pTVar15->layer_).convolution_;
  *(undefined8 *)&pCVar4->_kernelsize_cached_byte_size_ = 1;
  (pCVar4->stride_).current_size_ = 1;
  (pCVar4->stride_).total_size_ = 0;
  lVar5._0_4_ = (pCVar4->kernelsize_).current_size_;
  lVar5._4_4_ = (pCVar4->kernelsize_).total_size_;
  if (lVar5 == 0) {
    pWVar17 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar17);
    *(WeightParams **)&pCVar4->kernelsize_ = pWVar17;
  }
  lVar5 = *(long *)&pCVar4->kernelsize_;
  if (*(int *)(lVar5 + 0x10) == *(int *)(lVar5 + 0x14)) {
    google::protobuf::RepeatedField<float>::Reserve
              ((RepeatedField<float> *)(lVar5 + 0x10),*(int *)(lVar5 + 0x14) + 1);
  }
  iVar2 = *(int *)(lVar5 + 0x10);
  *(int *)(lVar5 + 0x10) = iVar2 + 1;
  *(undefined4 *)(*(long *)(lVar5 + 0x18) + 8 + (long)iVar2 * 4) = 0x3f800000;
  *(undefined1 *)&(pCVar4->stride_).rep_ = 0;
  pTVar15 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      ((RepeatedPtrFieldBase *)&(TVar14.pipeline_)->models_,(Type *)0x0);
  CoreML::Specification::NeuralNetworkLayer::add_input(pTVar15,"middle");
  CoreML::Specification::NeuralNetworkLayer::add_output(pTVar15,"output");
  if (pTVar15->_oneof_case_[0] != 0x8c) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pTVar15);
    pTVar15->_oneof_case_[0] = 0x8c;
    pIVar16 = (InnerProductLayerParams *)operator_new(0x38);
    CoreML::Specification::InnerProductLayerParams::InnerProductLayerParams(pIVar16);
    (pTVar15->layer_).innerproduct_ = pIVar16;
  }
  pCVar4 = (pTVar15->layer_).convolution_;
  *(undefined1 *)&(pCVar4->stride_).rep_ = 0;
  *(undefined8 *)&pCVar4->_kernelsize_cached_byte_size_ = 1;
  (pCVar4->stride_).current_size_ = 1;
  (pCVar4->stride_).total_size_ = 0;
  lVar6._0_4_ = (pCVar4->kernelsize_).current_size_;
  lVar6._4_4_ = (pCVar4->kernelsize_).total_size_;
  if (lVar6 == 0) {
    pWVar17 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar17);
    *(WeightParams **)&pCVar4->kernelsize_ = pWVar17;
  }
  lVar5 = *(long *)&pCVar4->kernelsize_;
  if (*(int *)(lVar5 + 0x10) == *(int *)(lVar5 + 0x14)) {
    google::protobuf::RepeatedField<float>::Reserve
              ((RepeatedField<float> *)(lVar5 + 0x10),*(int *)(lVar5 + 0x14) + 1);
  }
  iVar2 = *(int *)(lVar5 + 0x10);
  *(int *)(lVar5 + 0x10) = iVar2 + 1;
  *(undefined4 *)(*(long *)(lVar5 + 0x18) + 8 + (long)iVar2 * 4) = 0x3f800000;
  CoreML::validate<(MLModelType)403>((Result *)local_c0,&local_98);
  bVar7 = CoreML::Result::good((Result *)local_c0);
  if (!bVar7) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x6c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar18 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x3e4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18,"(res).good()",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) + (char)poVar18);
    std::ostream::put((char)poVar18);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._8_8_ != &local_a8) {
    operator_delete((void *)local_c0._8_8_,local_a8._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&local_98);
  return (uint)!bVar7;
}

Assistant:

int testNNCompilerValidation() {

    Specification::Model m1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);
    topIn->mutable_type()->mutable_multiarraytype()->set_datatype(::CoreML::Specification::ArrayFeatureType_ArrayDataType_DOUBLE);

    auto *out = m1.mutable_description()->add_output();
    out->set_name("middle");
    auto *outshape = out->mutable_type()->mutable_multiarraytype();
    outshape->add_shape(1);
    out->mutable_type()->mutable_multiarraytype()->set_datatype(::CoreML::Specification::ArrayFeatureType_ArrayDataType_DOUBLE);


    auto *out2 = m1.mutable_description()->add_output();
    out2->set_name("features");
    out2->mutable_type()->mutable_stringtype();

    auto *out3 = m1.mutable_description()->add_output();
    out3->set_name("probs");
    out3->mutable_type()->mutable_dictionarytype();
    out3->mutable_type()->mutable_dictionarytype()->mutable_stringkeytype();

    std::string featureName = "features";
    m1.mutable_description()->set_predictedfeaturename(featureName);
    std::string probsName = "probs";
    m1.mutable_description()->set_predictedprobabilitiesname(probsName);


    const auto nn = m1.mutable_neuralnetworkclassifier();
    auto labels = nn->mutable_stringclasslabels();
    labels->add_vector("label1");

    Specification::NeuralNetworkLayer *innerProductLayer = nn->add_layers();
    innerProductLayer->add_input("input");
    innerProductLayer->add_output("middle");
    Specification::InnerProductLayerParams *innerProductParams = innerProductLayer->mutable_innerproduct();
    innerProductParams->set_inputchannels(1);
    innerProductParams->set_outputchannels(1);
    innerProductParams->mutable_weights()->add_floatvalue(1.0);
    innerProductParams->set_hasbias(false);

    Specification::NeuralNetworkLayer *innerProductLayer2 = nn->add_layers();
    innerProductLayer2->add_input("middle");
    innerProductLayer2->add_output("output");
    Specification::InnerProductLayerParams *innerProductParams2 = innerProductLayer2->mutable_innerproduct();
    innerProductParams2->set_hasbias(false);
    innerProductParams2->set_inputchannels(1);
    innerProductParams2->set_outputchannels(1);
    innerProductParams2->mutable_weights()->add_floatvalue(1.0);

    Result res = validate<MLModelType_neuralNetworkClassifier>(m1);
    ML_ASSERT_GOOD(res);
    return 0;

}